

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O3

handle * __thiscall
gmlc::libguarded::guarded_opt<int,std::timed_mutex>::
try_lock_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (handle *__return_storage_ptr__,void *this,duration<long,_std::ratio<1L,_1000L>_> *d)

{
  duration<long,_std::ratio<1L,_1000L>_> *in_R8;
  unique_lock<std::timed_mutex> local_18;
  
  if (*(char *)((long)this + 0x30) == '\x01') {
    try_lock_handle_for<int,std::timed_mutex,std::chrono::duration<long,std::ratio<1l,1000l>>>
              (__return_storage_ptr__,(libguarded *)this,(int *)((long)this + 8),(timed_mutex *)d,
               in_R8);
  }
  else {
    __return_storage_ptr__->data = (pointer)this;
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto guarded_opt<T, M>::try_lock_for(const Duration& d) -> handle
{
    return (enabled) ? try_lock_handle_for(&m_obj, m_mutex, d) :
                       handle(&m_obj, std::unique_lock<M>());
}